

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

iterator * __thiscall
QPDFNameTreeObjectHelper::insert
          (iterator *__return_storage_ptr__,QPDFNameTreeObjectHelper *this,string *key,
          QPDFObjectHandle *value)

{
  __shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  undefined1 local_c8 [48];
  QPDFObjectHandle local_98;
  undefined1 local_88 [8];
  iterator i;
  QPDFObjectHandle *value_local;
  string *key_local;
  QPDFNameTreeObjectHelper *this_local;
  
  i.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value;
  this_00 = (__shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            __shared_ptr_access<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m);
  this_01 = std::__shared_ptr_access<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this_00);
  QPDFObjectHandle::newUnicodeString(&local_98,key);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)(local_c8 + 0x20),value);
  NNTreeImpl::insert((iterator *)local_88,this_01,&local_98,(QPDFObjectHandle *)(local_c8 + 0x20));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_c8 + 0x20));
  QPDFObjectHandle::~QPDFObjectHandle(&local_98);
  std::make_shared<NNTreeIterator,NNTreeIterator&>((NNTreeIterator *)local_c8);
  iterator::iterator(__return_storage_ptr__,(shared_ptr<NNTreeIterator> *)local_c8);
  std::shared_ptr<NNTreeIterator>::~shared_ptr((shared_ptr<NNTreeIterator> *)local_c8);
  NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_88);
  return __return_storage_ptr__;
}

Assistant:

QPDFNameTreeObjectHelper::iterator
QPDFNameTreeObjectHelper::insert(std::string const& key, QPDFObjectHandle value)
{
    auto i = m->impl->insert(QPDFObjectHandle::newUnicodeString(key), value);
    return {std::make_shared<NNTreeIterator>(i)};
}